

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_constant.cpp
# Opt level: O1

void duckdb::ConstantScanPartial<duckdb::hugeint_t>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  data_ptr_t pdVar1;
  int64_t *piVar2;
  hugeint_t hVar3;
  
  pdVar1 = result->data;
  hVar3 = NumericStats::GetMin<duckdb::hugeint_t>(&(segment->stats).statistics);
  if (scan_count != 0) {
    piVar2 = (int64_t *)(pdVar1 + result_offset * 0x10 + 8);
    do {
      piVar2[-1] = hVar3.lower;
      *piVar2 = hVar3.upper;
      piVar2 = piVar2 + 2;
      scan_count = scan_count - 1;
    } while (scan_count != 0);
  }
  return;
}

Assistant:

void ConstantScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                         idx_t result_offset) {
	ConstantFillFunction<T>(segment, result, result_offset, scan_count);
}